

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManIncrSimCone_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjIsCi(pObj_00);
  if ((iVar1 == 0) && (iVar1 = Vec_IntEntry(p->vTimeStamps,iObj), iVar1 != p->iTimeStamp)) {
    iVar1 = Vec_IntEntry(p->vTimeStamps,iObj);
    if (p->iTimeStamp <= iVar1) {
      __assert_fail("Vec_IntEntry(p->vTimeStamps, iObj) < p->iTimeStamp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                    ,0x4ae,"void Gia_ManIncrSimCone_rec(Gia_Man_t *, int)");
    }
    Vec_IntWriteEntry(p->vTimeStamps,iObj,p->iTimeStamp);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                    ,0x4b0,"void Gia_ManIncrSimCone_rec(Gia_Man_t *, int)");
    }
    iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
    Gia_ManIncrSimCone_rec(p,iVar1);
    iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
    Gia_ManIncrSimCone_rec(p,iVar1);
    Gia_ManBuiltInSimPerformInt(p,iObj);
  }
  return;
}

Assistant:

void Gia_ManIncrSimCone_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    if ( Vec_IntEntry(p->vTimeStamps, iObj) == p->iTimeStamp )
        return;
    assert( Vec_IntEntry(p->vTimeStamps, iObj) < p->iTimeStamp );
    Vec_IntWriteEntry( p->vTimeStamps, iObj, p->iTimeStamp );
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManIncrSimCone_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManIncrSimCone_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    Gia_ManBuiltInSimPerformInt( p, iObj );
}